

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_gettable(lua_State *L,int idx)

{
  byte tag;
  TValue *t;
  TValue *pTVar1;
  
  t = index2value(L,idx);
  tag = 0x30;
  if (t->tt_ == 'E') {
    pTVar1 = (TValue *)((L->top).offset + -0x10);
    tag = luaH_get((Table *)(t->value_).gc,pTVar1,pTVar1);
  }
  if ((tag & 0xf) == 0) {
    pTVar1 = (TValue *)((L->top).offset + -0x10);
    tag = luaV_finishget(L,t,pTVar1,(StkId)pTVar1,tag);
  }
  return (int)(tag & 0xf);
}

Assistant:

LUA_API int lua_gettable (lua_State *L, int idx) {
  lu_byte tag;
  TValue *t;
  lua_lock(L);
  api_checkpop(L, 1);
  t = index2value(L, idx);
  luaV_fastget(t, s2v(L->top.p - 1), s2v(L->top.p - 1), luaH_get, tag);
  if (tagisempty(tag))
    tag = luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, tag);
  lua_unlock(L);
  return novariant(tag);
}